

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

bool __thiscall QDockWidgetGroupWindow::hasVisibleDockWidgets(QDockWidgetGroupWindow *this)

{
  long *plVar1;
  long lVar2;
  QList<QDockWidget_*> *__range1;
  long in_FS_OFFSET;
  bool bVar3;
  bool bVar4;
  QList<QDockWidget_*> list;
  QArrayData *local_28;
  long *plStack_20;
  long local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QArrayData *)0x0;
  plStack_20 = (long *)0x0;
  local_18 = 0;
  qt_qFindChildren_helper(this,0,0,&QDockWidget::staticMetaObject,&local_28,1);
  bVar3 = local_18 != 0;
  if (bVar3) {
    if ((*(byte *)(*(long *)(*plStack_20 + 0x20) + 10) & 1) != 0) {
      lVar2 = 8;
      do {
        bVar4 = local_18 << 3 == lVar2;
        bVar3 = !bVar4;
        if (bVar4) break;
        plVar1 = (long *)((long)plStack_20 + lVar2);
        lVar2 = lVar2 + 8;
      } while ((*(byte *)(*(long *)(*plVar1 + 0x20) + 10) & 1) != 0);
    }
  }
  if (local_28 != (QArrayData *)0x0) {
    LOCK();
    (local_28->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_28,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockWidgetGroupWindow::hasVisibleDockWidgets() const
{
    const auto &children = findChildren<QDockWidget *>(Qt::FindChildrenRecursively);
    for (auto child : children) {
        // WA_WState_Visible is set on the dock widget, associated to the active tab
        // and unset on all others.
        // WA_WState_Hidden is set if the dock widgets have been explicitly hidden.
        // This is the relevant information to check (equivalent to !child->isHidden()).
        if (!child->testAttribute(Qt::WA_WState_Hidden))
            return true;
    }
    return false;
}